

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI,Index t,Index *oIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  int iVar4;
  const_reference pvVar5;
  size_t sVar6;
  ulong uVar7;
  uint in_ECX;
  int in_EDX;
  PlanningUnitMADPDiscrete *in_RDI;
  long in_R8;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  Index oI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrO;
  size_t vec_size;
  Index remainder;
  Index ohIwithinThisT;
  undefined4 in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffff9c;
  undefined4 local_3c;
  undefined4 local_28;
  
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)in_RDI,
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  local_28 = in_EDX - IVar3;
  sVar6 = GetNrObservations(in_RDI,in_stack_ffffffffffffff9c);
  for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sVar6);
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(ulong)(~local_3c + in_ECX));
    in_ZMM1 = ZEXT1664(auVar2);
    in_ZMM0._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    in_ZMM0._8_56_ = extraout_var;
    uVar7 = vcvttsd2usi_avx512f(in_ZMM0._0_16_);
    iVar4 = (int)(local_28 / uVar7);
    *(int *)(in_R8 + (ulong)local_3c * 4) = iVar4;
    local_28 = local_28 - iVar4 * (int)uVar7;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
    (Index agentI, Index ohI, Index t,  Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index ohIwithinThisT = ohI - CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t));
   
    Index remainder = ohIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrO = GetNrObservations(agentI);
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrO, (double)(stage));
        Index oI_t2 = remainder / b;
        oIs[t2] = oI_t2; 
        remainder -= oI_t2 * b;
    }
}